

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_find_operation(lyd_node *parent,uint32_t int_opts,lyd_node **op)

{
  char *pcVar1;
  ly_ctx *local_58;
  ly_ctx *local_50;
  ly_ctx *local_48;
  ly_ctx *local_38;
  lyd_node *local_30;
  lyd_node *iter;
  lyd_node **op_local;
  uint32_t int_opts_local;
  lyd_node *parent_local;
  
  *op = (lyd_node *)0x0;
  local_30 = parent;
  if (parent != (lyd_node *)0x0) {
    while ((local_30 != (lyd_node *)0x0 &&
           ((local_30->schema == (lysc_node *)0x0 || ((local_30->schema->nodetype & 0x700) == 0)))))
    {
      local_30 = lyd_parent(local_30);
    }
    if (local_30 != (lyd_node *)0x0) {
      if ((int_opts & 0x10) == 0) {
        if ((int_opts & 0xf) == 0) {
          if (parent->schema == (lysc_node *)0x0) {
            local_38 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_38 = parent->schema->module->ctx;
          }
          pcVar1 = lys_nodetype2str(local_30->schema->nodetype);
          ly_log(local_38,LY_LLERR,LY_EINVAL,
                 "Invalid parent %s \"%s\" node when not parsing any operation.",pcVar1,
                 local_30->schema->name);
          return LY_EINVAL;
        }
        if ((local_30->schema->nodetype == 0x100) && ((int_opts & 5) == 0)) {
          if (parent->schema == (lysc_node *)0x0) {
            local_48 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_48 = parent->schema->module->ctx;
          }
          ly_log(local_48,LY_LLERR,LY_EINVAL,
                 "Invalid parent RPC \"%s\" node when not parsing RPC nor rpc-reply.",
                 local_30->schema->name);
          return LY_EINVAL;
        }
        if ((local_30->schema->nodetype == 0x200) && ((int_opts & 6) == 0)) {
          if (parent->schema == (lysc_node *)0x0) {
            local_50 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_50 = parent->schema->module->ctx;
          }
          ly_log(local_50,LY_LLERR,LY_EINVAL,
                 "Invalid parent action \"%s\" node when not parsing action nor rpc-reply.",
                 local_30->schema->name);
          return LY_EINVAL;
        }
        if ((local_30->schema->nodetype == 0x400) && ((int_opts & 8) == 0)) {
          if (parent->schema == (lysc_node *)0x0) {
            local_58 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_58 = parent->schema->module->ctx;
          }
          ly_log(local_58,LY_LLERR,LY_EINVAL,
                 "Invalid parent notification \"%s\" node when not parsing a notification.",
                 local_30->schema->name);
          return LY_EINVAL;
        }
      }
      *op = local_30;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_parser_find_operation(const struct lyd_node *parent, uint32_t int_opts, struct lyd_node **op)
{
    const struct lyd_node *iter;

    *op = NULL;

    if (!parent) {
        /* no parent, nothing to look for */
        return LY_SUCCESS;
    }

    /* we need to find the operation node if it already exists */
    for (iter = parent; iter; iter = lyd_parent(iter)) {
        if (iter->schema && (iter->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))) {
            break;
        }
    }

    if (!iter) {
        /* no operation found */
        return LY_SUCCESS;
    }

    if (!(int_opts & LYD_INTOPT_ANY)) {
        if (!(int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent %s \"%s\" node when not parsing any operation.",
                    lys_nodetype2str(iter->schema->nodetype), iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_RPC) && !(int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent RPC \"%s\" node when not parsing RPC nor rpc-reply.",
                    iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_ACTION) && !(int_opts & (LYD_INTOPT_ACTION | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent action \"%s\" node when not parsing action nor rpc-reply.",
                    iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_NOTIF) && !(int_opts & LYD_INTOPT_NOTIF)) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent notification \"%s\" node when not parsing a notification.",
                    iter->schema->name);
            return LY_EINVAL;
        }
    }

    *op = (struct lyd_node *)iter;
    return LY_SUCCESS;
}